

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O2

void __thiscall cmExportFileGenerator::SetExportFile(cmExportFileGenerator *this,char *mainFile)

{
  string *filename;
  string sStack_38;
  
  filename = &this->MainImportFile;
  std::__cxx11::string::assign((char *)filename);
  cmsys::SystemTools::GetFilenamePath(&sStack_38,filename);
  std::__cxx11::string::operator=((string *)&this->FileDir,(string *)&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  cmsys::SystemTools::GetFilenameWithoutLastExtension(&sStack_38,filename);
  std::__cxx11::string::operator=((string *)&this->FileBase,(string *)&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  cmsys::SystemTools::GetFilenameLastExtension(&sStack_38,filename);
  std::__cxx11::string::operator=((string *)&this->FileExt,(string *)&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void cmExportFileGenerator::SetExportFile(const char* mainFile)
{
  this->MainImportFile = mainFile;
  this->FileDir = cmSystemTools::GetFilenamePath(this->MainImportFile);
  this->FileBase =
    cmSystemTools::GetFilenameWithoutLastExtension(this->MainImportFile);
  this->FileExt =
    cmSystemTools::GetFilenameLastExtension(this->MainImportFile);
}